

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * adios2sys::SystemTools::GetFilenamePath(string *filename)

{
  char *pcVar1;
  string *in_RSI;
  string *in_RDI;
  string *unaff_retaddr;
  size_type slash_pos;
  string fn;
  allocator local_51;
  undefined4 local_50;
  allocator local_49;
  long local_48;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,in_RSI);
  ConvertToUnixSlashes(unaff_retaddr);
  local_48 = std::__cxx11::string::rfind((char)local_30,0x2f);
  if (local_48 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"/",&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  else {
    if (local_48 == 2) {
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_30);
      if (*pcVar1 == ':') {
        std::__cxx11::string::resize((ulong)local_30);
        std::__cxx11::string::string((string *)in_RDI,local_30);
        goto LAB_00f3803d;
      }
    }
    if (local_48 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"",&local_51);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
    }
    else {
      std::__cxx11::string::resize((ulong)local_30);
      std::__cxx11::string::string((string *)in_RDI,local_30);
    }
  }
LAB_00f3803d:
  local_50 = 1;
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string SystemTools::GetFilenamePath(const std::string& filename)
{
  std::string fn = filename;
  SystemTools::ConvertToUnixSlashes(fn);

  std::string::size_type slash_pos = fn.rfind('/');
  if (slash_pos == 0) {
    return "/";
  }
  if (slash_pos == 2 && fn[1] == ':') {
    // keep the / after a drive letter
    fn.resize(3);
    return fn;
  }
  if (slash_pos == std::string::npos) {
    return "";
  }
  fn.resize(slash_pos);
  return fn;
}